

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall
Catch::Matchers::WithinRelMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,WithinRelMatcher *this)

{
  ReusableStringStream sstr;
  ReusableStringStream RStack_48;
  string local_38;
  
  ReusableStringStream::ReusableStringStream(&RStack_48);
  std::operator<<(RStack_48.m_oss,"and ");
  Catch::Detail::stringify<double>(&local_38,&this->m_target);
  std::operator<<(RStack_48.m_oss,(string *)&local_38);
  std::operator<<(RStack_48.m_oss," are within ");
  std::ostream::_M_insert<double>(this->m_epsilon * 100.0);
  std::operator<<(RStack_48.m_oss,"% of each other");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&RStack_48);
  return __return_storage_ptr__;
}

Assistant:

std::string WithinRelMatcher::describe() const {
        Catch::ReusableStringStream sstr;
        sstr << "and " << ::Catch::Detail::stringify(m_target) << " are within " << m_epsilon * 100. << "% of each other";
        return sstr.str();
    }